

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_ptr_field.h
# Opt level: O0

void __thiscall
google::protobuf::RepeatedPtrField<CoreML::Specification::LSTMWeightParams>::InternalSwap
          (RepeatedPtrField<CoreML::Specification::LSTMWeightParams> *this,
          RepeatedPtrField<CoreML::Specification::LSTMWeightParams> *other)

{
  RepeatedPtrField<CoreML::Specification::LSTMWeightParams> *other_local;
  RepeatedPtrField<CoreML::Specification::LSTMWeightParams> *this_local;
  
  internal::RepeatedPtrFieldBase::InternalSwap
            (&this->super_RepeatedPtrFieldBase,&other->super_RepeatedPtrFieldBase);
  return;
}

Assistant:

void InternalSwap(RepeatedPtrField* other) {
    internal::RepeatedPtrFieldBase::InternalSwap(other);
  }